

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          CappedArray<char,_8UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,String *params_5,
          ArrayPtr<const_char> *params_6,String *params_7,ArrayPtr<const_char> *params_8)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  CappedArray<char,_8UL> *pCVar3;
  String *pSVar4;
  char *pos;
  ArrayPtr<const_char> *rest_1;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_5;
  String *rest_6;
  ArrayPtr<const_char> *rest_7;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  _ *local_158;
  undefined8 local_150;
  Array<kj::StringTree::Branch> local_148;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  _ *local_d8;
  undefined8 local_d0;
  String local_c8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  _ *local_68;
  undefined8 local_60;
  undefined1 local_51;
  ArrayPtr<const_char> *local_50;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  CappedArray<char,_8UL> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_51 = 0;
  local_50 = params_3;
  params_local_4 = params_2;
  params_local_3 = (ArrayPtr<const_char> *)params_1;
  params_local_2 = params;
  params_local_1 = (CappedArray<char,_8UL> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_b0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_1);
  local_a8 = CappedArray<char,_8UL>::size((CappedArray<char,_8UL> *)params_local_2);
  local_a0 = ArrayPtr<const_char>::size(params_local_3);
  local_98 = ArrayPtr<const_char>::size(params_local_4);
  local_90 = ArrayPtr<const_char>::size(local_50);
  local_88 = String::size((String *)params_4);
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_5);
  local_78 = String::size((String *)params_6);
  local_70 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_7);
  local_68 = (_ *)&local_b0;
  local_60 = 9;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x9;
  sVar1 = _::sum(local_68,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_120 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar3 = fwd<kj::CappedArray<char,8ul>>((NoInfer<kj::CappedArray<char,_8UL>_> *)params_local_2);
  local_118 = flatSize<kj::CappedArray<char,8ul>>(pCVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_110 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_108 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_50);
  local_100 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_4);
  local_f8 = flatSize(pSVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  local_f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_6);
  local_e8 = flatSize(pSVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_7);
  local_e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_d8 = (_ *)&local_120;
  local_d0 = 9;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x9;
  sVar1 = _::sum(local_d8,nums_00);
  heapString(&local_c8,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_c8);
  String::~String(&local_c8);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_1a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar3 = fwd<kj::CappedArray<char,8ul>>((NoInfer<kj::CappedArray<char,_8UL>_> *)params_local_2);
  local_198 = branchCount<kj::CappedArray<char,8ul>>(pCVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_190 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_188 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_50);
  local_180 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_4);
  local_178 = branchCount(pSVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  local_170 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_6);
  local_168 = branchCount(pSVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_7);
  local_160 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_158 = (_ *)&local_1a0;
  local_150 = 9;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x9;
  sVar1 = _::sum(local_158,nums_01);
  heapArray<kj::StringTree::Branch>(&local_148,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_148);
  Array<kj::StringTree::Branch>::~Array(&local_148);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  pCVar3 = fwd<kj::CappedArray<char,8ul>>((NoInfer<kj::CappedArray<char,_8UL>_> *)params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_50);
  pSVar4 = fwd<kj::String>((NoInfer<kj::String> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  rest_6 = fwd<kj::String>((NoInfer<kj::String> *)params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_7);
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,pCVar3,rest_1,rest_2,rest_3,pSVar4,rest_5,rest_6,
             rest_7);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}